

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

void sc_data_init(sc_data_t *sc_data)

{
  _Bool _Var1;
  int index;
  size_t sVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  sc_t *psVar6;
  long lVar7;
  int lg_base;
  undefined8 in_R9;
  int iVar8;
  size_t sVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  int iVar13;
  int lg_ngroup;
  int in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  long lVar14;
  
  sc_data->sc[0].index = 0;
  sc_data->sc[0].lg_base = 3;
  sc_data->sc[0].lg_delta = 3;
  sc_data->sc[0].ndelta = 0;
  sc_data->sc[0].psz = false;
  sc_data->sc[0].bin = true;
  sc_data->sc[0].pgs = 1;
  sc_data->sc[0].lg_delta_lookup = 3;
  sc_data->sc[1].index = 1;
  sc_data->sc[1].lg_base = 3;
  sc_data->sc[1].lg_delta = 3;
  sc_data->sc[1].ndelta = 1;
  sc_data->sc[1].psz = false;
  sc_data->sc[1].bin = true;
  sc_data->sc[1].pgs = 1;
  sc_data->sc[1].lg_delta_lookup = 3;
  psVar6 = sc_data->sc + 2;
  uVar5 = 0;
  iVar10 = 2;
  lVar4 = -3;
  do {
    size_class(psVar6,(int)lVar4 + 5,4,4,(int)lVar4 + 4,(int)in_R9,in_stack_ffffffffffffff68,
               (int)in_stack_ffffffffffffff70);
    uVar5 = uVar5 + psVar6->psz;
    iVar10 = iVar10 + (uint)psVar6->bin;
    psVar6 = psVar6 + 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  lg_base = 0;
  lVar3 = 5;
  iVar8 = 1;
  lg_ngroup = 4;
  sVar9 = 0;
  sVar11 = 0;
  lVar4 = 6;
  do {
    uVar12 = 1;
    lVar14 = lVar4 + 1;
    iVar13 = (int)lVar3;
    lVar7 = lVar3 << 0x20;
    psVar6 = sc_data->sc + iVar13;
    do {
      index = (int)uVar12;
      size_class(psVar6,iVar13 + -1 + index,(int)lVar4,lg_ngroup,index,lg_base,
                 in_stack_ffffffffffffff68,(int)lVar14);
      sVar2 = (uVar12 << ((byte)lg_ngroup & 0x3f)) + (1L << ((byte)lVar4 & 0x3f));
      if (psVar6->lg_delta_lookup != 0) {
        iVar8 = iVar13 + index;
        sVar11 = sVar2;
      }
      uVar5 = uVar5 + psVar6->psz;
      _Var1 = psVar6->bin;
      if (_Var1 != false) {
        sVar9 = sVar2;
      }
      if (_Var1 != false) {
        lg_base = (int)lVar14;
      }
      iVar10 = iVar10 + (uint)_Var1;
      uVar12 = uVar12 + 1;
      lVar7 = lVar7 + 0x100000000;
      psVar6 = psVar6 + 1;
    } while (((ulong)(lVar4 == 0x3e) ^ 5) != uVar12);
    lg_ngroup = lg_ngroup + 1;
    lVar3 = (long)iVar13 + uVar12 + -1;
    lVar4 = lVar14;
  } while (lVar14 != 0x3f);
  uVar12 = lVar7 >> 0x20;
  lVar4 = 0x3f;
  if (uVar12 != 0) {
    for (; uVar12 >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  sc_data->ntiny = 1;
  sc_data->nlbins = iVar8;
  sc_data->nbins = iVar10;
  sc_data->nsizes = iVar13 + 3;
  sc_data->lg_ceil_nsizes = ((int)lVar4 + 1) - (uint)((uVar12 - 1 & uVar12) == 0);
  sc_data->npsizes = uVar5;
  sc_data->lg_tiny_maxclass = 3;
  sc_data->lookup_maxclass = sVar11;
  sc_data->small_maxclass = sVar9;
  sc_data->lg_large_minclass = lg_base;
  sc_data->large_minclass = 1L << ((byte)lg_base & 0x3f);
  sc_data->large_maxclass = sVar2;
  sc_data->initialized = true;
  return;
}

Assistant:

void
sc_data_init(sc_data_t *sc_data) {
	assert(!sc_data->initialized);

	int lg_max_lookup = 12;

	size_classes(sc_data, LG_SIZEOF_PTR, LG_QUANTUM, SC_LG_TINY_MIN,
	    lg_max_lookup, LG_PAGE, 2);

	sc_data->initialized = true;
}